

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int client_new(connectdata *conn,nghttp2_session_callbacks *callbacks)

{
  int iVar1;
  nghttp2_session_callbacks *callbacks_local;
  connectdata *conn_local;
  
  iVar1 = nghttp2_session_client_new(&(conn->proto).httpc.h2,callbacks,conn);
  return iVar1;
}

Assistant:

static int client_new(struct connectdata *conn,
                      nghttp2_session_callbacks *callbacks)
{
#if NGHTTP2_VERSION_NUM < 0x013200
  /* before 1.50.0 */
  return nghttp2_session_client_new(&conn->proto.httpc.h2, callbacks, conn);
#else
  nghttp2_option *o;
  int rc = nghttp2_option_new(&o);
  if(rc)
    return rc;
  /* turn off RFC 9113 leading and trailing white spaces validation against
     HTTP field value. */
  nghttp2_option_set_no_rfc9113_leading_and_trailing_ws_validation(o, 1);
  rc = nghttp2_session_client_new2(&conn->proto.httpc.h2, callbacks, conn,
                                   o);
  nghttp2_option_del(o);
  return rc;
#endif
}